

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createTexture_constant(SemanticParser *this,SP *in)

{
  long lVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar5;
  SP SVar6;
  SP tex;
  allocator<char> local_59;
  string local_58;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  std::make_shared<pbrt::ConstantTexture>();
  lVar1 = *in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"value",&local_59);
  bVar4 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar1 + 8),&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  peVar2 = local_38;
  lVar1 = *in_RDX;
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"value",&local_59);
    fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),&local_58,0.0);
    *(float *)&(local_38->cameras).
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data._M_start = fVar5;
    *(float *)((long)&(local_38->cameras).
                      super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      ._M_impl.super__Vector_impl_data + 4) = fVar5;
    *(float *)((long)&(local_38->cameras).
                      super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      ._M_impl.super__Vector_impl_data + 8) = fVar5;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"value",&local_59);
    syntactic::ParamSet::getParam3f((ParamSet *)(lVar1 + 8),(float *)&peVar2->cameras,&local_58);
  }
  std::__cxx11::string::~string((string *)&local_58);
  _Var3._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar6.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_constant(pbrt::syntactic::Texture::SP in)
  {
    ConstantTexture::SP tex = std::make_shared<ConstantTexture>();
    if (in->hasParam1f("value"))
      tex->value = vec3f(in->getParam1f("value"));
    else
      in->getParam3f(&tex->value.x,"value");
    return tex;
  }